

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O0

void __thiscall displayTest::test_method(displayTest *this)

{
  ostream *poVar1;
  string *psVar2;
  CartesianProduct local_458 [8];
  CartesianProduct S3;
  CartesianProduct local_3b8 [8];
  CartesianProduct S2;
  RealSpace *local_318;
  double *local_310;
  RealSpace *local_308;
  double *local_300;
  undefined1 *local_2f8;
  RealSpace *local_2f0;
  RealSpace **local_2e8;
  undefined8 local_2e0;
  CartesianProduct local_2d8 [8];
  CartesianProduct S;
  undefined1 local_238 [8];
  SO3<mnf::ExpMapMatrix> RotSpace;
  S2 Sphere;
  RealSpace local_110 [8];
  RealSpace R2;
  RealSpace local_88 [8];
  RealSpace R5;
  displayTest *this_local;
  
  mnf::RealSpace::RealSpace(local_88,5);
  mnf::Manifold::display();
  mnf::RealSpace::RealSpace(local_110,2);
  mnf::S2::S2((S2 *)(RotSpace.trustMagnitude_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array + 2));
  mnf::Manifold::display();
  mnf::SO3<mnf::ExpMapMatrix>::SO3((SO3<mnf::ExpMapMatrix> *)local_238);
  local_318 = local_88;
  local_310 = RotSpace.trustMagnitude_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 2;
  local_308 = local_110;
  local_2f8 = local_238;
  local_2e8 = &local_318;
  local_2e0 = 6;
  local_300 = local_310;
  local_2f0 = local_318;
  mnf::CartesianProduct::CartesianProduct(local_2d8,local_2e8,6);
  mnf::CartesianProduct::CartesianProduct(local_3b8,(Manifold *)local_2d8,(Manifold *)local_110);
  mnf::CartesianProduct::CartesianProduct(local_458,(Manifold *)local_2d8,(Manifold *)local_3b8);
  poVar1 = std::operator<<((ostream *)&std::cout,"S.name() = \n");
  psVar2 = (string *)mnf::Manifold::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  mnf::Manifold::display();
  poVar1 = std::operator<<((ostream *)&std::cout,"S2.name() = \n");
  psVar2 = (string *)mnf::Manifold::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  mnf::Manifold::display();
  poVar1 = std::operator<<((ostream *)&std::cout,"S3.name() = \n");
  psVar2 = (string *)mnf::Manifold::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  mnf::Manifold::display();
  mnf::CartesianProduct::~CartesianProduct(local_458);
  mnf::CartesianProduct::~CartesianProduct(local_3b8);
  mnf::CartesianProduct::~CartesianProduct(local_2d8);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3((SO3<mnf::ExpMapMatrix> *)local_238);
  mnf::S2::~S2((S2 *)(RotSpace.trustMagnitude_.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 2));
  mnf::RealSpace::~RealSpace(local_110);
  mnf::RealSpace::~RealSpace(local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(displayTest)
{
  RealSpace R5(5);
  R5.display();
  RealSpace R2(2);
  S2 Sphere;
  Sphere.display();
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S{&R5, &Sphere, &R2, &Sphere, &RotSpace, &R5};
  CartesianProduct S2(S, R2);
  CartesianProduct S3(S, S2);
  std::cout << "S.name() = \n" << S.name() << std::endl;
  S.display();
  std::cout << "S2.name() = \n" << S2.name() << std::endl;
  S2.display();
  std::cout << "S3.name() = \n" << S3.name() << std::endl;
  S3.display();
}